

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O2

size_t bitset_extract_intersection_setbits_uint16
                 (uint64_t *words1,uint64_t *words2,size_t length,uint16_t *out,uint16_t base)

{
  long lVar1;
  uint16_t *puVar2;
  int iVar3;
  size_t i;
  size_t sVar4;
  ulong uVar5;
  
  iVar3 = 0;
  for (sVar4 = 0; sVar4 != length; sVar4 = sVar4 + 1) {
    puVar2 = out + iVar3;
    for (uVar5 = words2[sVar4] & words1[sVar4]; uVar5 != 0; uVar5 = uVar5 & uVar5 - 1) {
      lVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      *puVar2 = (short)lVar1 + base;
      iVar3 = iVar3 + 1;
      puVar2 = puVar2 + 1;
    }
    base = base + 0x40;
  }
  return (long)iVar3;
}

Assistant:

size_t bitset_extract_intersection_setbits_uint16(
    const uint64_t *__restrict__ words1, const uint64_t *__restrict__ words2,
    size_t length, uint16_t *out, uint16_t base) {
    int outpos = 0;
    for (size_t i = 0; i < length; ++i) {
        uint64_t w = words1[i] & words2[i];
        while (w != 0) {
            int r = roaring_trailing_zeroes(w);
            out[outpos++] = (uint16_t)(r + base);
            w &= (w - 1);
        }
        base += 64;
    }
    return outpos;
}